

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O0

size_t lua_objlen(lua_State *L,int idx)

{
  int iVar1;
  TValue *obj;
  lua_State *local_40;
  size_t l;
  StkId o;
  int idx_local;
  lua_State *L_local;
  
  obj = index2adr(L,idx);
  switch(obj->tt) {
  case 3:
    iVar1 = luaV_tostring(L,obj);
    if (iVar1 == 0) {
      local_40 = (lua_State *)0x0;
    }
    else {
      local_40 = (lua_State *)(((obj->value).gc)->h).metatable;
    }
    L_local = local_40;
    break;
  case 4:
    L_local = (lua_State *)(((obj->value).gc)->h).metatable;
    break;
  case 5:
    iVar1 = luaH_getn(&((obj->value).gc)->h);
    L_local = (lua_State *)(long)iVar1;
    break;
  default:
    L_local = (lua_State *)0x0;
    break;
  case 7:
    L_local = (lua_State *)(((obj->value).gc)->h).node;
  }
  return (size_t)L_local;
}

Assistant:

static size_t lua_objlen(lua_State*L,int idx){
StkId o=index2adr(L,idx);
switch(ttype(o)){
case 4:return tsvalue(o)->len;
case 7:return uvalue(o)->len;
case 5:return luaH_getn(hvalue(o));
case 3:{
size_t l;
l=(luaV_tostring(L,o)?tsvalue(o)->len:0);
return l;
}
default:return 0;
}
}